

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strpos(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  uint uVar2;
  sxi32 sVar3;
  char *pBlob;
  char *pPattern;
  int nLen;
  sxu32 nOfft;
  int nPatLen;
  sxu32 local_34;
  sxu32 local_30;
  sxu32 local_2c;
  
  if (1 < nArg) {
    pBlob = jx9_value_to_string(*apArg,(int *)&local_34);
    pPattern = jx9_value_to_string(apArg[1],(int *)&local_2c);
    local_30 = 0;
    if (nArg == 2) {
      uVar2 = 0;
    }
    else {
      uVar2 = jx9_value_to_int(apArg[2]);
      uVar1 = -uVar2;
      if (0 < (int)uVar2) {
        uVar1 = uVar2;
      }
      uVar2 = 0;
      if (local_34 - uVar1 != 0 && (int)uVar1 <= (int)local_34) {
        pBlob = pBlob + uVar1;
        uVar2 = uVar1;
        local_34 = local_34 - uVar1;
      }
    }
    if ((0 < (int)local_2c && 0 < (int)local_34) &&
       (sVar3 = SyBlobSearch(pBlob,local_34,pPattern,local_2c,&local_30), sVar3 == 0)) {
      jx9_result_int64(pCtx,(ulong)(uVar2 + local_30));
      return 0;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_strpos(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	ProcStringMatch xPatternMatch = SyBlobSearch; /* Case-sensitive pattern match */
	const char *zBlob, *zPattern;
	int nLen, nPatLen, nStart;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the needle and the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	zPattern = jx9_value_to_string(apArg[1], &nPatLen);
	nOfft = 0; /* cc warning */
	nStart = 0;
	/* Peek the starting offset if available */
	if( nArg > 2 ){
		nStart = jx9_value_to_int(apArg[2]);
		if( nStart < 0 ){
			nStart = -nStart;
		}
		if( nStart >= nLen ){
			/* Invalid offset */
			nStart = 0;
		}else{
			zBlob += nStart;
			nLen -= nStart;
		}
	}
	if( nLen > 0 && nPatLen > 0 ){
		/* Perform the lookup */
		rc = xPatternMatch(zBlob, (sxu32)nLen, zPattern, (sxu32)nPatLen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the pattern position */
		jx9_result_int64(pCtx, (jx9_int64)(nOfft+nStart));
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}